

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendEcho
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *text,EchoColor color,EchoProgress *progress)

{
  char cVar1;
  char *pcVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  cmOutputConverter *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view str;
  string_view source;
  string_view str_00;
  string local_f8;
  string line;
  string color_name;
  string cmd;
  string local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  color_name._M_dataplus._M_p = (pointer)&color_name.field_2;
  color_name._M_string_length = 0;
  color_name.field_2._M_local_buf[0] = '\0';
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  if (((((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
        ToolSupportsColor == true) && (this->ColorMakefile == true)) && (color - EchoDepend < 5)) {
    std::__cxx11::string::_M_replace
              ((ulong)&color_name,0,(char *)0x0,
               (ulong)(&DAT_007a40ac + *(int *)(&DAT_007a40ac + (ulong)(color - EchoDepend) * 4)));
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&line);
  pcVar2 = (text->_M_dataplus)._M_p;
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  do {
    cVar1 = *pcVar2;
    if (cVar1 != '\r') {
      if (cVar1 == '\n') {
LAB_00502e26:
        cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
        cmd._M_string_length = 0;
        cmd.field_2._M_local_buf[0] = '\0';
        if (color_name._M_string_length == 0 && progress == (EchoProgress *)0x0) {
          str._M_str = line._M_dataplus._M_p;
          str._M_len = line._M_string_length;
          cmOutputConverter::EscapeForShell_abi_cxx11_
                    (&local_78,this_00,str,false,true,false,false,false);
          local_f8._M_dataplus._M_p = (pointer)0x6;
          local_f8._M_string_length = 0x7a4aab;
          local_f8.field_2._M_allocated_capacity = local_78._M_string_length;
          local_f8.field_2._8_8_ = local_78._M_dataplus._M_p;
          views._M_len = 2;
          views._M_array = (iterator)&local_f8;
          cmCatViews_abi_cxx11_(&local_50,views);
          std::__cxx11::string::operator=((string *)&cmd,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          uVar3 = local_78.field_2._M_allocated_capacity;
          _Var4._M_p = local_78._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_0050306e:
            operator_delete(_Var4._M_p,uVar3 + 1);
          }
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)0x38;
          local_f8._M_string_length = 0x7a4ab2;
          local_f8.field_2._M_allocated_capacity = color_name._M_string_length;
          local_f8.field_2._8_8_ = color_name._M_dataplus._M_p;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_f8;
          cmCatViews_abi_cxx11_(&local_50,views_00);
          std::__cxx11::string::operator=((string *)&cmd,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (progress != (EchoProgress *)0x0) {
            std::__cxx11::string::append((char *)&cmd);
            source._M_str = (progress->Dir)._M_dataplus._M_p;
            source._M_len = (progress->Dir)._M_string_length;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_f8,this_00,source,SHELL);
            std::__cxx11::string::_M_append((char *)&cmd,(ulong)local_f8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)&cmd);
            std::__cxx11::string::append((char *)&cmd);
            std::__cxx11::string::_M_append((char *)&cmd,(ulong)(progress->Arg)._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&cmd);
          }
          str_00._M_str = line._M_dataplus._M_p;
          str_00._M_len = line._M_string_length;
          cmOutputConverter::EscapeForShell_abi_cxx11_
                    (&local_f8,this_00,str_00,false,false,false,false,false);
          std::__cxx11::string::_M_append((char *)&cmd,(ulong)local_f8._M_dataplus._M_p);
          uVar3 = local_f8.field_2._M_allocated_capacity;
          _Var4._M_p = local_f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_0050306e;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_58,&cmd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmd._M_dataplus._M_p != &cmd.field_2) {
          operator_delete(cmd._M_dataplus._M_p,
                          CONCAT71(cmd.field_2._M_allocated_capacity._1_7_,
                                   cmd.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        if (cVar1 != '\0') {
          std::__cxx11::string::push_back((char)&line);
          goto LAB_005030bb;
        }
        if (line._M_string_length != 0) goto LAB_00502e26;
      }
      line._M_string_length = 0;
      *line._M_dataplus._M_p = '\0';
      if (*pcVar2 == '\0') {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p,
                          CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                   line.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)color_name._M_dataplus._M_p != &color_name.field_2) {
          operator_delete(color_name._M_dataplus._M_p,
                          CONCAT71(color_name.field_2._M_allocated_capacity._1_7_,
                                   color_name.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      progress = (EchoProgress *)0x0;
    }
LAB_005030bb:
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendEcho(
  std::vector<std::string>& commands, std::string const& text, EchoColor color,
  EchoProgress const* progress)
{
  // Choose the color for the text.
  std::string color_name;
  if (this->GlobalGenerator->GetToolSupportsColor() && this->ColorMakefile) {
    // See cmake::ExecuteEchoColor in cmake.cxx for these options.
    // This color set is readable on both black and white backgrounds.
    switch (color) {
      case EchoNormal:
        break;
      case EchoDepend:
        color_name = "--magenta --bold ";
        break;
      case EchoBuild:
        color_name = "--green ";
        break;
      case EchoLink:
        color_name = "--green --bold ";
        break;
      case EchoGenerate:
        color_name = "--blue --bold ";
        break;
      case EchoGlobal:
        color_name = "--cyan ";
        break;
    }
  }

  // Echo one line at a time.
  std::string line;
  line.reserve(200);
  for (const char* c = text.c_str();; ++c) {
    if (*c == '\n' || *c == '\0') {
      // Avoid writing a blank last line on end-of-string.
      if (*c != '\0' || !line.empty()) {
        // Add a command to echo this line.
        std::string cmd;
        if (color_name.empty() && !progress) {
          // Use the native echo command.
          cmd = cmStrCat("@echo ", this->EscapeForShell(line, false, true));
        } else {
          // Use cmake to echo the text in color.
          cmd = cmStrCat(
            "@$(CMAKE_COMMAND) -E cmake_echo_color --switch=$(COLOR) ",
            color_name);
          if (progress) {
            cmd += "--progress-dir=";
            cmd += this->ConvertToOutputFormat(progress->Dir,
                                               cmOutputConverter::SHELL);
            cmd += " ";
            cmd += "--progress-num=";
            cmd += progress->Arg;
            cmd += " ";
          }
          cmd += this->EscapeForShell(line);
        }
        commands.push_back(std::move(cmd));
      }

      // Reset the line to empty.
      line.clear();

      // Progress appears only on first line.
      progress = nullptr;

      // Terminate on end-of-string.
      if (*c == '\0') {
        return;
      }
    } else if (*c != '\r') {
      // Append this character to the current line.
      line += *c;
    }
  }
}